

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O3

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  uint uVar4;
  pointer piVar5;
  pointer puVar6;
  Expr *expr;
  int iVar7;
  Result RVar8;
  pointer pSVar9;
  pointer pSVar10;
  _func_int **pp_Var11;
  pointer ppEVar12;
  char *__function;
  pointer piVar13;
  Expr *pEVar14;
  Index catch_index;
  iterator iVar15;
  
  pSVar9 = (this->state_stack_).
           super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar9) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar9;
  }
  ppEVar12 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar12) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar12;
  }
  piVar5 = (this->expr_iter_stack_).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar5) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar5;
  }
  puVar6 = (this->catch_index_stack_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar6) {
    (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar6;
  }
  PushDefault(this,root_expr);
  pSVar9 = (this->state_stack_).
           super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != pSVar9) {
    do {
      if (Catch < pSVar9[-1]) goto LAB_001d258d;
      pSVar10 = pSVar9 + -1;
      ppEVar12 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      expr = ppEVar12[-1];
      ppEVar12 = ppEVar12 + -1;
      switch(pSVar9[-1]) {
      case Default:
        (this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar10;
        (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar12;
        RVar8 = HandleDefaultState(this,expr);
        goto LAB_001d2588;
      case Block:
        if (expr->type_ != Block) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
          goto LAB_001d2646;
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_) {
LAB_001d25ae:
          __assert_fail("list_ == rhs.list_",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                        ,0xbf,
                        "bool wabt::intrusive_list<wabt::Expr>::iterator::operator!=(iterator) const [T = wabt::Expr]"
                       );
        }
        if (piVar13[-1].node_ != (Expr *)0x0) {
LAB_001d23e3:
          piVar13 = piVar13 + -1;
LAB_001d23e7:
          iVar15 = intrusive_list<wabt::Expr>::iterator::operator++(piVar13,0);
          if (iVar15.node_ == (Expr *)0x0) {
            __assert_fail("node_",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                          ,0x99,
                          "reference wabt::intrusive_list<wabt::Expr>::iterator::operator*() const [T = wabt::Expr]"
                         );
          }
          PushDefault(this,iVar15.node_);
          break;
        }
        iVar7 = (*this->delegate_->_vptr_Delegate[4])();
        goto LAB_001d2552;
      case IfTrue:
        if (expr->type_ != If) {
LAB_001d2603:
          __function = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_001d2646:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                        ,0x4e,__function);
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_)
        goto LAB_001d25ae;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_001d23e3;
        iVar7 = (*this->delegate_->_vptr_Delegate[0x13])(this->delegate_,expr);
        if (iVar7 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        PushExprlist(this,IfFalse,expr,(ExprList *)&expr[6].super_intrusive_list_base<wabt::Expr>);
        break;
      case IfFalse:
        if (expr->type_ != If) goto LAB_001d2603;
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[6].super_intrusive_list_base<wabt::Expr>)
        goto LAB_001d25ae;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_001d23e3;
        iVar7 = (*this->delegate_->_vptr_Delegate[0x14])();
        goto LAB_001d2552;
      case Loop:
        if (expr->type_ != Loop) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
          ;
          goto LAB_001d2646;
        }
        piVar13 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar13[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_)
        goto LAB_001d25ae;
        if (piVar13[-1].node_ != (Expr *)0x0) goto LAB_001d23e3;
        iVar7 = (*this->delegate_->_vptr_Delegate[0x1a])();
LAB_001d2552:
        if (iVar7 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        break;
      case Try:
        if (expr->type_ != Try) {
LAB_001d25ec:
          __function = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
          goto LAB_001d2646;
        }
        piVar5 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar5[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_)
        goto LAB_001d25ae;
        piVar13 = piVar5 + -1;
        if (piVar5[-1].node_ != (Expr *)0x0) goto LAB_001d23e7;
        (this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar10;
        (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar12;
        (this->expr_iter_stack_).
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_finish = piVar13;
        iVar7 = *(int *)&expr->field_0x3c;
        if (iVar7 == 0) {
LAB_001d2568:
          pp_Var11 = this->delegate_->_vptr_Delegate;
        }
        else {
          if (iVar7 == 2) {
            RVar8.enum_ = (*this->delegate_->_vptr_Delegate[0x36])();
            goto LAB_001d2588;
          }
          if (iVar7 != 1) break;
          pEVar14 = expr[6].super_intrusive_list_base<wabt::Expr>.next_;
          pp_Var11 = this->delegate_->_vptr_Delegate;
          if (pEVar14 != expr[6].super_intrusive_list_base<wabt::Expr>.prev_) {
            iVar7 = (*pp_Var11[0x35])(this->delegate_,expr,pEVar14);
            if (iVar7 == 1) {
              return (Result)Error;
            }
            catch_index = 0;
            goto LAB_001d253f;
          }
        }
        RVar8.enum_ = (*pp_Var11[0x37])();
LAB_001d2588:
        if (RVar8.enum_ == Error) {
          return (Result)Error;
        }
        break;
      case Catch:
        if (expr->type_ != Try) goto LAB_001d25ec;
        piVar5 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar6 = (this->catch_index_stack_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar4 = puVar6[-1];
        pEVar14 = expr[6].super_intrusive_list_base<wabt::Expr>.next_;
        if (piVar5[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&pEVar14[(ulong)uVar4 * 2 + 1].loc.field_1)
        goto LAB_001d25ae;
        piVar13 = piVar5 + -1;
        if (piVar5[-1].node_ != (Expr *)0x0) goto LAB_001d23e7;
        (this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar10;
        (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar12;
        (this->expr_iter_stack_).
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_finish = piVar13;
        (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar6 + -1;
        catch_index = uVar4 + 1;
        if ((ulong)((long)expr[6].super_intrusive_list_base<wabt::Expr>.prev_ - (long)pEVar14 >> 7)
            <= (ulong)catch_index) goto LAB_001d2568;
        pEVar14 = pEVar14 + (ulong)catch_index * 2;
        iVar7 = (*this->delegate_->_vptr_Delegate[0x35])(this->delegate_,expr,pEVar14);
        if (iVar7 == 1) {
          return (Result)Error;
        }
LAB_001d253f:
        PushCatch(this,expr,catch_index,(ExprList *)&pEVar14[1].loc.field_1.field_0);
      }
LAB_001d258d:
      pSVar9 = (this->state_stack_).
               super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_start != pSVar9);
  }
  return (Result)Ok;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();
  catch_index_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopExprlist();
          switch (try_expr->kind) {
            case TryKind::Catch:
              if (!try_expr->catches.empty()) {
                Catch& catch_ = try_expr->catches[0];
                CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
                PushCatch(expr, 0, catch_.exprs);
              } else {
                CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              }
              break;
            case TryKind::Delegate:
              CHECK_RESULT(delegate_->OnDelegateExpr(try_expr));
              break;
            case TryKind::Plain:
              CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              break;
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        Index catch_index = catch_index_stack_.back();
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catches[catch_index].exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopCatch();
          catch_index++;
          if (catch_index < try_expr->catches.size()) {
            Catch& catch_ = try_expr->catches[catch_index];
            CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
            PushCatch(expr, catch_index, catch_.exprs);
          } else {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          }
        }
        break;
      }
    }
  }

  return Result::Ok;
}